

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::SpectrumBilerpTexture::ToString_abi_cxx11_(SpectrumBilerpTexture *this)

{
  string *in_RDI;
  SpectrumHandle *in_stack_00000008;
  SpectrumHandle *in_stack_00000010;
  TextureMapping2DHandle *in_stack_00000020;
  char *in_stack_00000028;
  SpectrumHandle *in_stack_00000040;
  
  StringPrintf<pbrt::TextureMapping2DHandle_const&,pbrt::SpectrumHandle_const&,pbrt::SpectrumHandle_const&,pbrt::SpectrumHandle_const&,pbrt::SpectrumHandle_const&>
            (in_stack_00000028,in_stack_00000020,(SpectrumHandle *)this,in_stack_00000010,
             in_stack_00000008,in_stack_00000040);
  return in_RDI;
}

Assistant:

std::string SpectrumBilerpTexture::ToString() const {
    return StringPrintf(
        "[ SpectrumBilerpTexture mapping: %s v00: %s v01: %s v10: %s v11: %s ]", mapping,
        v00, v01, v10, v11);
}